

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_create_all_obj(command *cmd)

{
  object_kind *poVar1;
  _Bool _Var2;
  object *obj;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  for (uVar4 = 0; poVar1 = k_info, uVar4 < z_info->k_max; uVar4 = uVar4 + 1) {
    if ((*(long **)(k_info->flags + lVar3 + -0x70) != (long *)0x0) &&
       (**(long **)(k_info->flags + lVar3 + -0x70) != 0)) {
      _Var2 = flag_has_dbg(k_info->kind_flags + lVar3,4,0x12,"kind->kind_flags","KF_INSTA_ART");
      if (!_Var2) {
        obj = wiz_create_object_from_kind((object_kind *)(poVar1->flags + lVar3 + -0x80));
        wiz_drop_object(obj);
      }
    }
    lVar3 = lVar3 + 0x2c0;
  }
  return;
}

Assistant:

void do_cmd_wiz_create_all_obj(struct command *cmd)
{
	int i;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		struct object *obj;

		if (kind->base == NULL || kind->base->name == NULL) continue;
		if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

		obj = wiz_create_object_from_kind(kind);
		wiz_drop_object(obj);
	}
}